

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClusterList.h
# Opt level: O0

void __thiscall
SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U>::SegmentClusterList
          (SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U> *this,
          JitArenaAllocator *allocator,uint maxCount)

{
  JitArenaAllocator *this_00;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_01;
  uint **ppuVar1;
  uint local_64;
  TrackAllocData local_48;
  uint local_1c;
  JitArenaAllocator *pJStack_18;
  uint maxCount_local;
  JitArenaAllocator *allocator_local;
  SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U> *this_local;
  
  local_64 = maxCount;
  if ((maxCount & 0xf) != 0) {
    local_64 = maxCount + (0x10 - (maxCount & 0xf));
  }
  this->maxIndex = local_64;
  this->backingStore = (uint **)0x0;
  this->consolidated = true;
  this->alloc = allocator;
  this_00 = this->alloc;
  local_1c = maxCount;
  pJStack_18 = allocator;
  allocator_local = (JitArenaAllocator *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&unsigned_int*::typeinfo,0,(ulong)(this->maxIndex >> 4),
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ClusterList.h"
             ,0x107);
  this_01 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                           this_00,&local_48);
  ppuVar1 = Memory::AllocateArray<Memory::JitArenaAllocator,unsigned_int*,false>
                      ((Memory *)this_01,(JitArenaAllocator *)Memory::JitArenaAllocator::AllocZero,0
                       ,(ulong)(this->maxIndex >> 4));
  this->backingStore = ppuVar1;
  return;
}

Assistant:

SegmentClusterList(TAllocator* allocator, indexType maxCount)
        : maxIndex(maxCount % numPerSegment == 0 ? maxCount : maxCount + (numPerSegment - (maxCount % numPerSegment)))
        , backingStore(nullptr)
        , alloc(allocator)
#if DBG
        , consolidated(true)
#endif
    {
        backingStore = AllocatorNewArrayZ(TAllocator, alloc, indexType*, maxIndex / numPerSegment);
    }